

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O3

size_t xmi_process_INFO(PBuffer *buffer,MidiFile *param_2)

{
  element_type *peVar1;
  Stream *this;
  size_type *psVar2;
  undefined1 auStack_68 [8];
  size_type *local_60;
  size_type local_50 [2];
  string local_40 [16];
  size_type local_30 [2];
  
  peVar1 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1->size == 2) {
    peVar1->read = peVar1->read + 2;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"xmi2mid","");
    Log::Logger::operator[]((Logger *)auStack_68,(string *)&Log::Verbose);
    this = Log::Stream::operator<<((Stream *)auStack_68,"\tXMI contains ");
    std::ostream::_M_insert<unsigned_long>((ulong)this->stream);
    Log::Stream::operator<<(this," track(s)");
    Log::Stream::~Stream((Stream *)auStack_68);
    local_30[0] = local_50[0];
    psVar2 = local_60;
    if (local_60 == local_50) goto LAB_00138e88;
  }
  else {
    local_40._0_8_ = local_30;
    std::__cxx11::string::_M_construct<char_const*>(local_40,"xmi2mid","");
    Log::Logger::operator[]((Logger *)auStack_68,(string *)&Log::Debug);
    Log::Stream::operator<<((Stream *)auStack_68,"\tInconsistent INFO block.");
    Log::Stream::~Stream((Stream *)auStack_68);
    psVar2 = (size_type *)local_40._0_8_;
    if ((size_type *)local_40._0_8_ == local_30) goto LAB_00138e88;
  }
  operator_delete(psVar2,local_30[0] + 1);
LAB_00138e88:
  return ((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size;
}

Assistant:

static size_t
xmi_process_INFO(PBuffer buffer, MidiFile * /*midi*/) {
  if (buffer->get_size() != 2) {
    Log::Debug["xmi2mid"] << "\tInconsistent INFO block.";
  } else {
    uint16_t track_count = buffer->pop<uint16_t>();
    Log::Verbose["xmi2mid"] << "\tXMI contains " << track_count << " track(s)";
  }
  return buffer->get_size();
}